

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O0

void __thiscall
ConfidentialTransactionContext_Constructor_Test::TestBody
          (ConfidentialTransactionContext_Constructor_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  char *pcVar4;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ConfidentialTransactionContext copy_tx3;
  ConfidentialTransactionContext copy_tx2;
  ConfidentialTransaction ctx;
  ConfidentialTransactionContext copy_tx;
  ConfidentialTransactionContext byte_tx;
  ConfidentialTransactionContext str_tx;
  ConfidentialTransactionContext empty_tx;
  string exp_tx_str;
  ConfidentialTransactionContext *in_stack_fffffffffffff850;
  undefined4 in_stack_fffffffffffff858;
  char *in_stack_fffffffffffff860;
  undefined7 in_stack_fffffffffffff868;
  AssertHelper local_718;
  Message local_710;
  undefined4 local_708;
  undefined4 local_704;
  AssertionResult local_700;
  AssertHelper local_6f0;
  Message local_6e8;
  string local_6e0 [32];
  string local_6c0 [32];
  AssertionResult local_6a0;
  AssertHelper local_690;
  Message local_688;
  string local_680 [32];
  string local_660 [32];
  AssertionResult local_640;
  AssertHelper local_630;
  Message local_628;
  string local_620 [32];
  string local_600 [32];
  AssertionResult local_5e0;
  AssertHelper local_5d0;
  Message local_5c8;
  string local_5c0 [32];
  string local_5a0 [32];
  AssertionResult local_580;
  AssertHelper local_570;
  Message local_568;
  string local_560 [32];
  string local_540 [32];
  AssertionResult local_520;
  ConfidentialTransactionContext local_510 [184];
  ConfidentialTransactionContext local_458 [184];
  ConfidentialTransaction local_3a0 [64];
  ConfidentialTransactionContext local_360 [191];
  allocator local_2a1;
  string local_2a0 [32];
  ByteData local_280;
  ConfidentialTransactionContext local_268 [184];
  ConfidentialTransactionContext local_1b0 [184];
  ConfidentialTransactionContext local_f8 [207];
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_28,
             "02000000000109c4149d4e59119f2b11b3e160b02694bc4ecbf56f6de4ab587128f86bf4e7d30000000000ffffffff0201f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000005ee3fe00374eb131b54a7b528e5449b3827bcaa5069c259346810f20cf9079bd17b32fe481976a914d753351535a2a55f33ab39bbd6c70a55d46904e788ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000"
             ,&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(local_f8);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(local_1b0,local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2a0,
             "02000000000109c4149d4e59119f2b11b3e160b02694bc4ecbf56f6de4ab587128f86bf4e7d30000000000ffffffff0201f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000005ee3fe00374eb131b54a7b528e5449b3827bcaa5069c259346810f20cf9079bd17b32fe481976a914d753351535a2a55f33ab39bbd6c70a55d46904e788ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000"
             ,&local_2a1);
  cfd::core::ByteData::ByteData(&local_280,local_2a0);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(local_268,&local_280);
  cfd::core::ByteData::~ByteData((ByteData *)0x1d22a3);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(local_360,local_1b0);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction(local_3a0,local_28);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(local_458,local_3a0);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(local_510);
  cfd::ConfidentialTransactionContext::operator=(local_510,local_1b0);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_520,"str_tx.GetHex().c_str()","byte_tx.GetHex().c_str()",pcVar3,
             pcVar4);
  std::__cxx11::string::~string(local_560);
  std::__cxx11::string::~string(local_540);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_520);
  if (!bVar1) {
    testing::Message::Message(&local_568);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1d25a4);
    testing::internal::AssertHelper::AssertHelper
              (&local_570,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x48,pcVar3);
    testing::internal::AssertHelper::operator=(&local_570,&local_568);
    testing::internal::AssertHelper::~AssertHelper(&local_570);
    testing::Message::~Message((Message *)0x1d2601);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d2659);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_580,"str_tx.GetHex().c_str()","copy_tx.GetHex().c_str()",pcVar3,
             pcVar4);
  std::__cxx11::string::~string(local_5c0);
  std::__cxx11::string::~string(local_5a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_580);
  if (!bVar1) {
    testing::Message::Message(&local_5c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1d2797);
    testing::internal::AssertHelper::AssertHelper
              (&local_5d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x49,pcVar3);
    testing::internal::AssertHelper::operator=(&local_5d0,&local_5c8);
    testing::internal::AssertHelper::~AssertHelper(&local_5d0);
    testing::Message::~Message((Message *)0x1d27f4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d284c);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_5e0,"str_tx.GetHex().c_str()","copy_tx2.GetHex().c_str()",pcVar3,
             pcVar4);
  std::__cxx11::string::~string(local_620);
  std::__cxx11::string::~string(local_600);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5e0);
  if (!bVar1) {
    testing::Message::Message(&local_628);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1d298a);
    testing::internal::AssertHelper::AssertHelper
              (&local_630,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x4a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_630,&local_628);
    testing::internal::AssertHelper::~AssertHelper(&local_630);
    testing::Message::~Message((Message *)0x1d29e7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d2a3f);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_640,"str_tx.GetHex().c_str()","copy_tx3.GetHex().c_str()",pcVar3,
             pcVar4);
  std::__cxx11::string::~string(local_680);
  std::__cxx11::string::~string(local_660);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_640);
  if (!bVar1) {
    testing::Message::Message(&local_688);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1d2b7d);
    testing::internal::AssertHelper::AssertHelper
              (&local_690,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x4b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_690,&local_688);
    testing::internal::AssertHelper::~AssertHelper(&local_690);
    testing::Message::~Message((Message *)0x1d2bda);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d2c32);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTRNE
            ((internal *)&local_6a0,"str_tx.GetHex().c_str()","empty_tx.GetHex().c_str()",pcVar3,
             pcVar4);
  std::__cxx11::string::~string(local_6e0);
  std::__cxx11::string::~string(local_6c0);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_6a0);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_6e8);
    in_stack_fffffffffffff860 =
         testing::AssertionResult::failure_message((AssertionResult *)0x1d2d70);
    testing::internal::AssertHelper::AssertHelper
              (&local_6f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x4c,in_stack_fffffffffffff860);
    testing::internal::AssertHelper::operator=(&local_6f0,&local_6e8);
    testing::internal::AssertHelper::~AssertHelper(&local_6f0);
    testing::Message::~Message((Message *)0x1d2dcd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d2e22);
  local_704 = cfd::ConfidentialTransactionContext::GetLockTimeDisabledSequence();
  local_708 = 0xffffffff;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((char *)CONCAT17(uVar2,in_stack_fffffffffffff868),in_stack_fffffffffffff860,
             (uint *)CONCAT44(local_704,in_stack_fffffffffffff858),(uint *)in_stack_fffffffffffff850
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_700);
  if (!bVar1) {
    testing::Message::Message(&local_710);
    in_stack_fffffffffffff850 =
         (ConfidentialTransactionContext *)
         testing::AssertionResult::failure_message((AssertionResult *)0x1d2ed9);
    testing::internal::AssertHelper::AssertHelper
              (&local_718,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x4e,(char *)in_stack_fffffffffffff850);
    testing::internal::AssertHelper::operator=(&local_718,&local_710);
    testing::internal::AssertHelper::~AssertHelper(&local_718);
    testing::Message::~Message((Message *)0x1d2f36);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d2f8b);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(in_stack_fffffffffffff850);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(in_stack_fffffffffffff850);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction
            ((ConfidentialTransaction *)in_stack_fffffffffffff850);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(in_stack_fffffffffffff850);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(in_stack_fffffffffffff850);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(in_stack_fffffffffffff850);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(in_stack_fffffffffffff850);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, Constructor)
{
  std::string exp_tx_str = "02000000000109c4149d4e59119f2b11b3e160b02694bc4ecbf56f6de4ab587128f86bf4e7d30000000000ffffffff0201f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000005ee3fe00374eb131b54a7b528e5449b3827bcaa5069c259346810f20cf9079bd17b32fe481976a914d753351535a2a55f33ab39bbd6c70a55d46904e788ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000";
  ConfidentialTransactionContext empty_tx;
  ConfidentialTransactionContext str_tx(exp_tx_str);
  ConfidentialTransactionContext byte_tx(
      ByteData("02000000000109c4149d4e59119f2b11b3e160b02694bc4ecbf56f6de4ab587128f86bf4e7d30000000000ffffffff0201f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000005ee3fe00374eb131b54a7b528e5449b3827bcaa5069c259346810f20cf9079bd17b32fe481976a914d753351535a2a55f33ab39bbd6c70a55d46904e788ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000"));
  ConfidentialTransactionContext copy_tx(str_tx);
  ConfidentialTransaction ctx(exp_tx_str);
  ConfidentialTransactionContext copy_tx2(ctx);
  ConfidentialTransactionContext copy_tx3;
  copy_tx3 = str_tx;

  EXPECT_STREQ(str_tx.GetHex().c_str(), byte_tx.GetHex().c_str());
  EXPECT_STREQ(str_tx.GetHex().c_str(), copy_tx.GetHex().c_str());
  EXPECT_STREQ(str_tx.GetHex().c_str(), copy_tx2.GetHex().c_str());
  EXPECT_STREQ(str_tx.GetHex().c_str(), copy_tx3.GetHex().c_str());
  EXPECT_STRNE(str_tx.GetHex().c_str(), empty_tx.GetHex().c_str());

  EXPECT_EQ(ConfidentialTransactionContext::GetLockTimeDisabledSequence(), 0xffffffffU);
}